

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O2

void wallify_vault(monst *grd)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  obj *otmp;
  trap *trap;
  char *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int x;
  long lVar15;
  char cVar16;
  long lVar17;
  long lVar18;
  level *plVar19;
  int y;
  monst *mtmp;
  long lVar20;
  long lVar21;
  obj *in_stack_ffffffffffffff58;
  long local_68;
  
  iVar9 = *(int *)((long)&grd[1].nmon + 4);
  cVar16 = level->rooms[iVar9].ly + -1;
  lVar21 = (long)cVar16;
  lVar17 = (long)(char)(level->rooms[iVar9].hy + '\x01');
  lVar10 = (long)(char)(level->rooms[iVar9].lx + -1);
  lVar15 = (long)(char)(level->rooms[iVar9].hx + '\x01');
  lVar18 = lVar17 - lVar21;
  lVar12 = lVar10 * 0xfc + lVar21 * 0xc + 0x46;
  local_68 = lVar10 * 0xa8 + lVar21 * 8 + 0x8380;
  bVar2 = false;
  bVar3 = false;
  for (lVar11 = lVar10; lVar11 <= lVar15; lVar11 = lVar11 + 1) {
    lVar13 = lVar12;
    for (lVar20 = 0; plVar19 = level, lVar21 + lVar20 <= lVar17; lVar20 = lVar20 + 1) {
      if (((lVar18 == lVar20) || (lVar20 == 0 || (lVar11 == lVar15 || lVar11 == lVar10))) &&
         (level->levname[lVar13 + -2] == '\0' || '\f' < level->levname[lVar13 + -2])) {
        iVar9 = (int)cVar16 + (int)lVar20;
        x = (int)lVar11;
        bVar4 = in_fcorridor(grd,x,iVar9);
        if (bVar4 == '\0') {
          mtmp = *(monst **)(plVar19->levname + lVar20 * 8 + local_68);
          if (mtmp != (monst *)0x0) {
            if ((mtmp->field_0x61 & 2) != 0) {
              mtmp = (monst *)0x0;
            }
            if (mtmp != grd && mtmp != (monst *)0x0) {
              if (mtmp->mtame != '\0') {
                yelp(mtmp);
                plVar19 = level;
              }
              rloc(plVar19,mtmp,'\0');
              plVar19 = level;
            }
          }
          otmp = gold_at(plVar19,x,iVar9);
          if (otmp != (obj *)0x0) {
            iVar14 = *(int *)((long)&grd[1].nmon + 4);
            remove_object(otmp);
            newsym((int)otmp->ox,(int)otmp->oy);
            cVar5 = level->rooms[iVar14].lx;
            uVar6 = mt_random();
            cVar1 = level->rooms[iVar14].ly;
            uVar7 = mt_random();
            iVar14 = (int)(char)(((byte)uVar6 & 1) + cVar5);
            y = (int)(char)(((byte)uVar7 & 1) + cVar1);
            place_object(otmp,level,iVar14,y);
            stackobj(in_stack_ffffffffffffff58);
            newsym(iVar14,y);
            bVar3 = true;
          }
          trap = t_at(level,x,iVar9);
          if (trap != (trap *)0x0) {
            deltrap(level,trap);
          }
          plVar19 = level;
          if (lVar11 == lVar10) {
            cVar5 = (lVar18 == lVar20) * '\x04' + '\x01';
            if (lVar20 == 0) {
              cVar5 = '\x03';
            }
          }
          else {
            cVar5 = '\x02';
            if ((lVar11 == lVar15) && (cVar5 = (lVar18 == lVar20) * '\x05' + '\x01', lVar20 == 0)) {
              cVar5 = '\x04';
            }
          }
          level->levname[lVar13 + -2] = cVar5;
          *(uint *)(plVar19->levname + lVar13) = *(uint *)(plVar19->levname + lVar13) & 0xfffffe0f;
          cVar5 = viz_array[lVar21 + lVar20][lVar11];
          viz_array[lVar21 + lVar20][lVar11] = '\x03';
          newsym(x,iVar9);
          viz_array[lVar21 + lVar20][lVar11] = cVar5;
          block_point(x,iVar9);
          bVar2 = true;
        }
      }
      lVar13 = lVar13 + 0xc;
    }
    lVar12 = lVar12 + 0xfc;
    local_68 = local_68 + 0xa8;
  }
  if (bVar3 || bVar2) {
    cVar16 = grd->mx;
    cVar5 = grd->my;
    bVar4 = in_fcorridor(grd,(int)cVar16,(int)cVar5);
    if ((bVar4 == '\0') && ((viz_array[(int)cVar5][(int)cVar16] & 2U) == 0)) {
      You_hear("a distant chant.");
    }
    else {
      pcVar8 = x_monnam(grd,0,(char *)0x0,1,'\0');
      pline("The %s whispers an incantation.",pcVar8);
    }
    if (bVar3) {
      pline("A mysterious force moves the gold into the vault.");
    }
    if (bVar2) {
      pline("The damaged vault\'s walls are magically restored!");
      return;
    }
  }
  return;
}

Assistant:

static void wallify_vault(struct monst *grd)
{
	int x, y, typ;
	int vlt = EGD(grd)->vroom;
	char tmp_viz;
	xchar lox = level->rooms[vlt].lx - 1, hix = level->rooms[vlt].hx + 1,
	      loy = level->rooms[vlt].ly - 1, hiy = level->rooms[vlt].hy + 1;
	struct monst *mon;
	struct obj *gold;
	struct trap *trap;
	boolean fixed = FALSE;
	boolean movedgold = FALSE;

	for (x = lox; x <= hix; x++)
	    for (y = loy; y <= hiy; y++) {
		/* if not on the room boundary, skip ahead */
		if (x != lox && x != hix && y != loy && y != hiy) continue;

		if (!IS_WALL(level->locations[x][y].typ) && !in_fcorridor(grd, x, y)) {
		    if ((mon = m_at(level, x, y)) != 0 && mon != grd) {
			if (mon->mtame) yelp(mon);
			rloc(level, mon, FALSE);
		    }
		    if ((gold = gold_at(level, x, y)) != 0) {
			move_gold(gold, EGD(grd)->vroom);
			movedgold = TRUE;
		    }
		    if ((trap = t_at(level, x, y)) != 0)
			deltrap(level, trap);
		    if (x == lox)
			typ = (y == loy) ? TLCORNER :
			      (y == hiy) ? BLCORNER : VWALL;
		    else if (x == hix)
			typ = (y == loy) ? TRCORNER :
			      (y == hiy) ? BRCORNER : VWALL;
		    else  /* not left or right side, must be top or bottom */
			typ = HWALL;
		    level->locations[x][y].typ = typ;
		    level->locations[x][y].doormask = 0;
		    /*
		     * hack: player knows walls are restored because of the
		     * message, below, so show this on the screen.
		     */
		    tmp_viz = viz_array[y][x];
		    viz_array[y][x] = IN_SIGHT|COULD_SEE;
		    newsym(x,y);
		    viz_array[y][x] = tmp_viz;
		    block_point(x,y);
		    fixed = TRUE;
		}
	    }

	if (movedgold || fixed) {
	    if (in_fcorridor(grd, grd->mx, grd->my) || cansee(grd->mx, grd->my))
		pline("The %s whispers an incantation.", g_monnam(grd));
	    else You_hear("a distant chant.");
	    if (movedgold)
		pline("A mysterious force moves the gold into the vault.");
	    if (fixed)
		pline("The damaged vault's walls are magically restored!");
	}
}